

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterBool::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterBool *this)

{
  bool expected;
  uint uVar1;
  _Elt_pointer this_00;
  long in_RDI;
  Value *in_stack_00000048;
  bool ok;
  string errs;
  CharReader *reader;
  char doc [27];
  Value root;
  CharReaderBuilder b;
  Value *in_stack_fffffffffffffe88;
  Value *in_stack_fffffffffffffe90;
  uint line;
  CharReaderBuilder *this_01;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  CharReaderBuilder *in_stack_fffffffffffffea0;
  uint line_00;
  TestResult *result;
  char *in_stack_fffffffffffffea8;
  string *expected_00;
  TestResult *this_02;
  CharReaderBuilder *in_stack_fffffffffffffec0;
  string local_128 [39];
  undefined1 local_101 [40];
  byte local_d9;
  TestResult local_d8;
  
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffea0);
  Json::Value::Value((Value *)in_stack_fffffffffffffea0,
                     CONCAT13(in_stack_fffffffffffffe9f,
                              CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)));
  local_d8.name_._M_dataplus = (_Alloc_hider)0xa;
  local_d8.name_._1_2_ = 0x6f63;
  local_d8.name_._3_8_ = 0x2f2a746e656d6d;
  local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x2a2f206575727420;
  local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node._0_3_ = 0x617274;
  local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node._3_5_ = 0x676e696c69;
  Json::Value::Value(in_stack_fffffffffffffe90,SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0));
  Json::Value::operator[]
            ((Value *)in_stack_fffffffffffffea0,
             (char *)CONCAT17(in_stack_fffffffffffffe9f,
                              CONCAT16(in_stack_fffffffffffffe9e,
                                       CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                                      )));
  line_00 = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  Json::Value::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  line = (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  Json::Value::~Value((Value *)in_stack_fffffffffffffec0);
  this_00 = (_Elt_pointer)Json::CharReaderBuilder::newCharReader(in_stack_fffffffffffffec0);
  this_02 = &local_d8;
  local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = this_00;
  std::__cxx11::string::string((string *)this_02);
  uVar1 = (*((_func_int **)
            ((ValueHolder *)
            &(local_d8.failures_.
              super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur)->file_)->int_)[2])
                    (local_d8.failures_.
                     super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur,
                     &local_d8.failures_.
                      super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last,
                     (undefined1 *)((long)&local_d8.name_._M_string_length + 2),
                     (undefined1 *)((long)&local_d8.name_.field_2 + 8),this_02);
  local_d9 = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (this_02,in_stack_fffffffffffffea8,line_00,
               (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))));
  }
  result = *(TestResult **)(in_RDI + 8);
  expected_00 = (string *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"",(allocator *)expected_00);
  std::__cxx11::string::string(local_128,(string *)&local_d8);
  JsonTest::checkStringEqual
            (this_02,expected_00,(string *)result,
             (char *)CONCAT17(in_stack_fffffffffffffe9f,
                              CONCAT16(in_stack_fffffffffffffe9e,
                                       CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                                      )),line,(char *)in_stack_fffffffffffffe88);
  uVar1 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  this_01 = *(CharReaderBuilder **)(in_RDI + 8);
  expected = Json::Value::asBool(in_stack_00000048);
  JsonTest::checkEqual<bool,bool>
            (result,expected,(bool)in_stack_fffffffffffffe9e,(char *)this_01,uVar1,(char *)0x163070)
  ;
  if (local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur != (_Elt_pointer)0x0) {
    (*((_func_int **)
      ((ValueHolder *)
      &(local_d8.failures_.super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur)->file_)->int_)[1])();
  }
  std::__cxx11::string::~string((string *)&local_d8);
  Json::Value::~Value((Value *)this_00);
  Json::CharReaderBuilder::~CharReaderBuilder(this_01);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}